

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void canvas_savetofile(_glist *x,t_symbol *filename,t_symbol *dir,float fdestroy)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  _binbuf *b_00;
  int *piVar4;
  t_symbol *sel;
  char *local_48;
  _binbuf *b;
  float fdestroy_local;
  t_symbol *dir_local;
  t_symbol *filename_local;
  _glist *x_local;
  
  b_00 = binbuf_new();
  canvas_savetemplatesto(x,b_00,1);
  canvas_saveto(x,b_00);
  piVar4 = __errno_location();
  *piVar4 = 0;
  iVar3 = binbuf_write(b_00,filename->s_name,dir->s_name,0);
  if (iVar3 == 0) {
    if (x->gl_owner == (_glist *)0x0) {
      canvas_rename(x,filename,dir);
      canvas_updatewindowlist();
    }
    post("saved to: %s/%s",dir->s_name,filename->s_name);
    canvas_dirty(x,0.0);
    canvas_reload(filename,dir,x);
    if ((fdestroy != 0.0) || (NAN(fdestroy))) {
      sel = gensym("menuclose");
      pd_vmess((t_pd *)x,sel,"f",0x3ff0000000000000);
    }
  }
  else {
    pcVar1 = dir->s_name;
    pcVar2 = filename->s_name;
    piVar4 = __errno_location();
    if (*piVar4 == 0) {
      local_48 = "write failed";
    }
    else {
      piVar4 = __errno_location();
      local_48 = strerror(*piVar4);
    }
    post("%s/%s: %s",pcVar1,pcVar2,local_48);
  }
  binbuf_free(b_00);
  return;
}

Assistant:

static void canvas_savetofile(t_canvas *x, t_symbol *filename, t_symbol *dir,
    float fdestroy)
{
    t_binbuf *b = binbuf_new();
    canvas_savetemplatesto(x, b, 1);
    canvas_saveto(x, b);
    errno = 0;
    if (binbuf_write(b, filename->s_name, dir->s_name, 0))
        post("%s/%s: %s", dir->s_name, filename->s_name,
            (errno ? strerror(errno) : "write failed"));
    else
    {
            /* if not an abstraction, reset title bar and directory */
        if (!x->gl_owner)
{
            canvas_rename(x, filename, dir);
            /* update window list in case Save As changed the window name */
            canvas_updatewindowlist();
}
        post("saved to: %s/%s", dir->s_name, filename->s_name);
        canvas_dirty(x, 0);
        canvas_reload(filename, dir, x);
        if (fdestroy != 0)
            vmess(&x->gl_pd, gensym("menuclose"), "f", 1.);
    }
    binbuf_free(b);
}